

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::ShiftProbabilityAndUtility
          (BayesianGameWithClusterInfo *this,Index agI,Index t1,Index t2)

{
  BayesianGameIdenticalPayoff *this_00;
  undefined1 auVar1 [16];
  RewardModelDiscreteInterface *pRVar2;
  ulong uVar3;
  void *pvVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  Index IVar9;
  Index IVar10;
  undefined4 extraout_var;
  size_t sVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrElems;
  Index jaI;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIndices2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  double local_a0;
  double local_98;
  value_type local_90;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_88;
  Index local_70;
  Index local_6c;
  container_type *local_68;
  double local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  double local_38;
  
  uVar3 = (ulong)agI;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  local_6c = t2;
  iVar8 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
            super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])(this_00);
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
             CONCAT44(extraout_var,iVar8),(value_type_conflict1 *)&local_58,
             (allocator_type *)&local_90);
  puVar6 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar5 = local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_88.d_;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_88.
                super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                .c_;
  local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_88.i_;
  auVar15 = ZEXT864(0) << 0x40;
  local_88.
  super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  .c_ = (container_type *)0x0;
  local_88.i_ = 0;
  local_88.d_ = 0.0;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)puVar6 - (long)puVar5);
  }
  if (local_88.
      super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      .c_ != (container_type *)0x0) {
    operator_delete(local_88.
                    super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                    .c_,(long)local_88.d_ -
                        (long)local_88.
                              super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                              .c_);
  }
  local_68 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_jTypeProbsSparse;
  nrElems = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
             super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes;
  local_70 = t1;
  local_40 = nrElems;
  do {
    dVar13 = auVar15._0_8_;
    if ((ulong)((long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3);
    }
    if (*(Index *)((long)(size_type *)
                         local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar3 * 4) == t1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,&local_b8);
      if ((ulong)((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  CONCAT44(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      *(Index *)(CONCAT44(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar3 * 4) = local_6c;
      IVar9 = IndexTools::IndividualToJointIndicesStepSize
                        (&local_b8,
                         (this->super_BayesianGameForDecPOMDPStage).
                         super_BayesianGameIdenticalPayoff.
                         super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                         _m_stepSizeTypes);
      IVar10 = IndexTools::IndividualToJointIndicesStepSize
                         (&local_58,
                          (this->super_BayesianGameForDecPOMDPStage).
                          super_BayesianGameIdenticalPayoff.
                          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                          _m_stepSizeTypes);
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar9);
      local_98 = dVar13;
      (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this_00,(ulong)IVar10);
      auVar15 = ZEXT864((ulong)dVar13);
      local_90 = dVar13 + local_98;
      local_a0 = dVar13;
      local_60 = local_90;
      if ((this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_useSparse == true) {
        local_88.
        super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
        .c_ = local_68;
        local_88.i_ = (ulong)IVar9;
        boost::numeric::ublas::
        sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
        ::set(&local_88,&local_90);
      }
      else {
        (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
        super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_jTypeProbs.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [IVar9] = local_90;
      }
      local_90 = 0.0;
      if ((this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
          super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_useSparse == true) {
        local_88.i_ = (size_type)IVar10;
        local_88.
        super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
        .c_ = local_68;
        boost::numeric::ublas::
        sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
        ::set(&local_88,&local_90);
      }
      else {
        (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
        super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_jTypeProbs.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [IVar10] = 0.0;
      }
      if (this->_m_clusterAlgorithm != Lossless) {
        local_38 = local_98 / local_60;
        local_a0 = local_a0 / local_60;
        auVar15 = ZEXT864((ulong)local_a0);
        uVar12 = 0;
        while( true ) {
          sVar11 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)this_00);
          dVar13 = auVar15._0_8_;
          if (sVar11 <= uVar12) break;
          (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this_00,(ulong)IVar9,uVar12);
          local_98 = dVar13;
          (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this_00,(ulong)IVar10,uVar12);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_98;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_38;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar13 * local_a0;
          auVar1 = vfmadd132sd_fma(auVar14,auVar16,auVar1);
          auVar15 = ZEXT1664(auVar1);
          pRVar2 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                   _m_utilFunction;
          (*(pRVar2->super_QTableInterface)._vptr_QTableInterface[1])(pRVar2,(ulong)IVar9,uVar12);
          uVar12 = (ulong)((int)uVar12 + 1);
        }
      }
      pvVar4 = (void *)CONCAT44(local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      nrElems = local_40;
      t1 = local_70;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_58.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
        nrElems = local_40;
        t1 = local_70;
      }
    }
    bVar7 = IndexTools::Increment(&local_b8,nrElems);
  } while (!bVar7);
  if ((container_type *)
      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (container_type *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BayesianGameWithClusterInfo::ShiftProbabilityAndUtility(Index agI, Index t1, Index t2)
{
    

    //add the probability mass of the joint types in which
    //t2 participates to the corresponding joint types
    //of t1.
    vector<Index> typeIndices;
    //first we compute the marginals P(t1) and P(t2)
    double p1, p2 = 0.0;
    double u1, u2 = 0;
    typeIndices = vector<Index>(GetNrAgents(), 0 );
    bool finished = false;
    while( !finished )
    {
        //only if agent agI's component is t1 we do stuff
        if(typeIndices.at(agI) == t1)
        {
            vector<Index> typeIndices2 = typeIndices;
            typeIndices2.at(agI) = t2;
            Index jtI1 = IndividualToJointTypeIndices( 
                    typeIndices);
            Index jtI2 = IndividualToJointTypeIndices( 
                    typeIndices2);
            p1 = GetProbability(jtI1);
            p2 = GetProbability(jtI2);

            SetProbability(jtI1, p1+p2);
            SetProbability(jtI2, 0.0);

            // if are doing approximate clustering, also update the
            // utility by a weighted sum
            if(_m_clusterAlgorithm!=Lossless)
            {
                for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
                {
                    u1 = GetUtility(jtI1,jaI);
                    u2 = GetUtility(jtI2,jaI);

                    // set the weighted utility
                    SetUtility(jtI1, jaI, (p1/(p1+p2))*u1 + (p2/(p1+p2))*u2);
                }
            }
        }        
        finished = 
            IndexTools::Increment(typeIndices, _m_nrTypes);
    }
}